

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

wchar_t chance_of_spell_hit(monster *mon,monster_spell *spell)

{
  wchar_t wVar1;
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t i;
  wchar_t to_hit;
  monster_spell *spell_local;
  monster *mon_local;
  
  local_1c = chance_of_spell_hit_base(mon->race,spell);
  local_20 = L'\0';
  while( true ) {
    wVar1 = monster_effect_level(mon,L'\x02');
    if (wVar1 <= local_20) break;
    local_1c = (local_1c * 0x50) / 100;
    local_20 = local_20 + L'\x01';
  }
  return local_1c;
}

Assistant:

static int chance_of_spell_hit(const struct monster *mon,
	const struct monster_spell *spell)
{
	int to_hit = chance_of_spell_hit_base(mon->race, spell);

	/* Apply confusion hit reduction for each level of confusion */
	for (int i = 0; i < monster_effect_level(mon, MON_TMD_CONF); i++) {
		to_hit = to_hit * (100 - CONF_HIT_REDUCTION) / 100;
	}

	return to_hit;
}